

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O0

void iemgui_dolabel(void *x,t_iemgui *iemgui,t_symbol *s,int senditup)

{
  t_symbol *ptVar1;
  int iVar2;
  t_symbol *ptVar3;
  _glist *p_Var4;
  char *local_f0;
  bool local_d1;
  t_symbol *local_d0;
  char local_c8 [8];
  char tag [128];
  int have_label;
  char *label;
  t_symbol *old;
  t_symbol *empty;
  t_symbol *ptStack_20;
  int senditup_local;
  t_symbol *s_local;
  t_iemgui *iemgui_local;
  void *x_local;
  
  ptVar3 = gensym("");
  ptVar1 = iemgui->x_lab;
  if (s == (t_symbol *)0x0) {
    local_d0 = (t_symbol *)0x0;
  }
  else {
    local_d0 = canvas_realizedollar(iemgui->x_glist,s);
  }
  ptStack_20 = local_d0;
  if (((local_d0 != (t_symbol *)0x0) && (local_d0->s_name != (char *)0x0)) &&
     (*local_d0->s_name != '\0')) {
    iVar2 = strcmp(local_d0->s_name,"empty");
    if (iVar2 != 0) goto LAB_00146e00;
  }
  ptStack_20 = ptVar3;
LAB_00146e00:
  iemgui->x_lab = ptStack_20;
  empty._4_4_ = senditup;
  if (senditup < 0) {
    iVar2 = glist_isvisible(iemgui->x_glist);
    local_d1 = false;
    if (iVar2 != 0) {
      local_d1 = iemgui->x_lab != ptVar1;
    }
    empty._4_4_ = (uint)local_d1;
  }
  if (empty._4_4_ != 0) {
    tag._124_4_ = ZEXT14(ptStack_20 != ptVar3);
    sprintf(local_c8,"%lxLABEL",x);
    p_Var4 = glist_getcanvas(iemgui->x_glist);
    if (tag._124_4_ == 0) {
      local_f0 = "";
    }
    else {
      local_f0 = ptStack_20->s_name;
    }
    pdgui_vmess("pdtk_text_set","cs s",p_Var4,local_c8,local_f0);
    iemgui_dolabelpos((t_object *)x,iemgui);
  }
  return;
}

Assistant:

void iemgui_dolabel(void *x, t_iemgui *iemgui, t_symbol *s, int senditup)
{
    t_symbol *empty = gensym("");
    t_symbol *old = iemgui->x_lab;
    s = s?canvas_realizedollar(iemgui->x_glist, s):0;
    if (!(s && s->s_name && s->s_name[0] && strcmp(s->s_name, "empty")))
        s = empty;
    iemgui->x_lab = s;

    if(senditup < 0) {
        senditup = (glist_isvisible(iemgui->x_glist) && iemgui->x_lab != old);
    }

    if(senditup)
    {
        const char*label = s->s_name;
        int have_label = (s != empty);
        char tag[128];
        sprintf(tag, "%lxLABEL", x);
        pdgui_vmess("pdtk_text_set", "cs s",
            glist_getcanvas(iemgui->x_glist), tag,
            have_label?s->s_name:"");
        iemgui_dolabelpos(x, iemgui);
    }
}